

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv2maropu.cpp
# Opt level: O3

void print(externalvector *ev)

{
  ostream *poVar1;
  ulong uVar2;
  size_t pos;
  vector<unsigned_int,_std::allocator<unsigned_int>_> x;
  DataType local_48;
  
  if (*(long *)(ev + 8) != 0) {
    pos = 0;
    do {
      FastPForLib::externalvector::get(&local_48,ev,pos);
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar2 = 0;
        do {
          poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          uVar2 = uVar2 + 1;
        } while (uVar2 < (ulong)((long)local_48.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_48.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
      std::ostream::put('H');
      std::ostream::flush();
      if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      pos = pos + 1;
    } while (pos < *(ulong *)(ev + 8));
  }
  return;
}

Assistant:

void print(externalvector &ev) {
  for (size_t i = 0; i < ev.size(); ++i) {
    vector<uint32_t> x = ev.get(i);
    for (size_t k = 0; k < x.size(); ++k)
      cout << x[k] << " ";
    cout << endl;
  }
}